

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::_InternalSerialize
          (DictionaryValue_KeyValuePair *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  void *data;
  ulong uVar2;
  int size;
  Value *pVVar3;
  uint8_t *puVar4;
  size_t __n;
  
  pVVar3 = this->key_;
  if (pVVar3 != (Value *)0x0 &&
      this != (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pVVar3 = this->key_;
    }
    *target = '\n';
    uVar1 = (pVVar3->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = Value::_InternalSerialize(pVVar3,puVar4,stream);
  }
  pVVar3 = this->value_;
  if (pVVar3 != (Value *)0x0 &&
      this != (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pVVar3 = this->value_;
    }
    *target = '\x12';
    uVar1 = (pVVar3->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = Value::_InternalSerialize(pVVar3,puVar4,stream);
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    uVar2 = uVar2 & 0xfffffffffffffffc;
    data = *(void **)(uVar2 + 8);
    size = (int)*(undefined8 *)(uVar2 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar4;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* DictionaryValue_KeyValuePair::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.Value key = 1;
  if (this->_internal_has_key()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::key(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.Value value = 2;
  if (this->_internal_has_value()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::value(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
  return target;
}